

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void com_ipred_l(pel *src,pel *dst,int i_dst,pel *tmp_buf,int ipm,int w,int h,int bit_depth,
                u16 avail_cu,u8 ipf_flag)

{
  int local_f8;
  int local_f4;
  int local_ec;
  int local_e8;
  int w_local;
  int ipm_local;
  pel *tmp_buf_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  s8 *filter_vert_param;
  s8 *filter_hori_param;
  int local_a0;
  s32 hor_filter_range;
  s32 ver_filter_range;
  s32 filter_idx_ver;
  s32 filter_idx_hor;
  s8 *filter_vert_param_1;
  s8 *filter_hori_param_1;
  s32 hor_filter_range_1;
  s32 ver_filter_range_1;
  s32 filter_idx_ver_1;
  s32 filter_idx_hor_1;
  
  if ((ipm == 1) || (ipm == 2)) {
    if (ipf_flag == '\0') {
      if (ipm == 1) {
        (*uavs3d_funs_handle.intra_pred_plane[0])(src,dst,i_dst,w,h,bit_depth);
      }
      else if (ipm == 2) {
        (*uavs3d_funs_handle.intra_pred_bi[0])(src,dst,i_dst,w,h,bit_depth);
      }
    }
    else {
      if (ipm == 1) {
        (*uavs3d_funs_handle.intra_pred_plane_ipf)(src,(s16 *)tmp_buf,w,h);
      }
      else if (ipm == 2) {
        (*uavs3d_funs_handle.intra_pred_bi_ipf)(src,(s16 *)tmp_buf,w,h);
      }
      ver_filter_range_1 = g_tbl_log2[w] + -2;
      hor_filter_range_1 = g_tbl_log2[h] + -2;
      if (h < 10) {
        local_f4 = h;
      }
      else {
        local_f4 = 10;
      }
      filter_hori_param_1._4_4_ = local_f4;
      local_f8 = w;
      if (9 < w) {
        local_f8 = 10;
      }
      filter_hori_param_1._0_4_ = local_f8;
      if (4 < ver_filter_range_1) {
        ver_filter_range_1 = 4;
        filter_hori_param_1._0_4_ = 0;
      }
      if (4 < hor_filter_range_1) {
        hor_filter_range_1 = 4;
        filter_hori_param_1._4_4_ = 0;
      }
      if ((2 < ipm) && (ipm < 0x13)) {
        filter_hori_param_1._4_4_ = 0;
      }
      if (0x12 < ipm) {
        filter_hori_param_1._0_4_ = 0;
      }
      (*uavs3d_funs_handle.intra_pred_ipf_s16)
                (src,dst,i_dst,(s16 *)tmp_buf,(int)filter_hori_param_1,filter_hori_param_1._4_4_,
                 g_ipf_pred_param[ver_filter_range_1],g_ipf_pred_param[hor_filter_range_1],w,h,
                 bit_depth);
    }
  }
  else {
    if (ipm == 0) {
      (*uavs3d_funs_handle.intra_pred_dc[0])(src,dst,i_dst,w,h,avail_cu,bit_depth);
    }
    else if (ipm == 0xc) {
      (*uavs3d_funs_handle.intra_pred_ver[0])(src + 1,dst,i_dst,w,h);
    }
    else if (ipm == 0x18) {
      (*uavs3d_funs_handle.intra_pred_hor[0])(src + -1,dst,i_dst,w,h);
    }
    else {
      (*uavs3d_funs_handle.intra_pred_ang[ipm])(src,dst,i_dst,ipm,w,h);
    }
    if (ipf_flag != '\0') {
      ver_filter_range = g_tbl_log2[w] + -2;
      hor_filter_range = g_tbl_log2[h] + -2;
      if (h < 10) {
        local_e8 = h;
      }
      else {
        local_e8 = 10;
      }
      local_a0 = local_e8;
      local_ec = w;
      if (9 < w) {
        local_ec = 10;
      }
      filter_hori_param._4_4_ = local_ec;
      if (4 < ver_filter_range) {
        ver_filter_range = 4;
        filter_hori_param._4_4_ = 0;
      }
      if (4 < hor_filter_range) {
        hor_filter_range = 4;
        local_a0 = 0;
      }
      if ((2 < ipm) && (ipm < 0x13)) {
        local_a0 = 0;
      }
      if (0x12 < ipm) {
        filter_hori_param._4_4_ = 0;
      }
      (*uavs3d_funs_handle.intra_pred_ipf)
                (src,dst,i_dst,filter_hori_param._4_4_,local_a0,g_ipf_pred_param[ver_filter_range],
                 g_ipf_pred_param[hor_filter_range],w,h,bit_depth);
    }
  }
  return;
}

Assistant:

void com_ipred_l(pel *src, pel *dst, int i_dst, pel *tmp_buf, int ipm, int w, int h, int bit_depth, u16 avail_cu, u8 ipf_flag)
{
    uavs3d_assert(w <= 64 && h <= 64);
  
    if (ipm != IPD_PLN && ipm != IPD_BI) {
        switch (ipm) {
        case IPD_VER:
            uavs3d_funs_handle.intra_pred_ver[Y_C](src + 1, dst, i_dst, w, h);
            break;
        case IPD_HOR:
            uavs3d_funs_handle.intra_pred_hor[Y_C](src - 1, dst, i_dst, w, h);
            break;
        case IPD_DC:
            uavs3d_funs_handle.intra_pred_dc[Y_C](src, dst, i_dst, w, h, avail_cu, bit_depth);
            break;
        default:
            uavs3d_funs_handle.intra_pred_ang[ipm](src, dst, i_dst, ipm, w, h);
            break;
        }
        if (ipf_flag) {
            uavs3d_assert((w < MAX_CU_SIZE) && (h < MAX_CU_SIZE));
            ipf_core(src, dst, i_dst, ipm, w, h, bit_depth);
        }
    } else {
        if (ipf_flag) {
            switch (ipm) {
            case IPD_PLN:
                uavs3d_funs_handle.intra_pred_plane_ipf(src, (s16*)tmp_buf, w, h);
                break;
            case IPD_BI:
                uavs3d_funs_handle.intra_pred_bi_ipf(src, (s16*)tmp_buf, w, h);
                break;
            }
            uavs3d_assert((w < MAX_CU_SIZE) && (h < MAX_CU_SIZE));
            ipf_core_s16(src, dst, i_dst, (s16*)tmp_buf, ipm, w, h, bit_depth);
        } else {
            switch (ipm) {
            case IPD_PLN:
                uavs3d_funs_handle.intra_pred_plane[Y_C](src, dst, i_dst, w, h, bit_depth);
                break;
            case IPD_BI:
                uavs3d_funs_handle.intra_pred_bi[Y_C](src, dst, i_dst, w, h, bit_depth);
                break;
            }
        }
    }
}